

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

Message * __thiscall google::protobuf::MapValueConstRef::GetMessageValue(MapValueConstRef *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  char *local_48;
  char *local_40 [3];
  LogMessageFatal local_28 [23];
  Voidify local_11;
  MapValueConstRef *local_10;
  MapValueConstRef *this_local;
  
  local_10 = this;
  CVar1 = type(this);
  if (CVar1 != CPPTYPE_MESSAGE) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map_field.h"
               ,0x30f);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [34])"Protocol Buffer map usage error:\n");
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [34])"MapValueConstRef::GetMessageValue");
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [22])" type does not match\n");
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [14])"  Expected : ");
    local_40[0] = FieldDescriptor::CppTypeName(CPPTYPE_MESSAGE);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                       (pLVar2,local_40);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0x603aea)
    ;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [14])"  Actual   : ");
    CVar1 = type(this);
    local_48 = FieldDescriptor::CppTypeName(CVar1);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                       (pLVar2,&local_48);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
  }
  return (Message *)this->data_;
}

Assistant:

const Message& GetMessageValue() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_MESSAGE,
               "MapValueConstRef::GetMessageValue");
    return *reinterpret_cast<Message*>(data_);
  }